

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

void resolve_iffeature_getsizes(lys_iffeature *iffeat,uint *expr_size,uint *feat_size)

{
  int iVar1;
  byte bVar2;
  int pos;
  uint uVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  
  if (iffeat == (lys_iffeature *)0x0) {
    __assert_fail("iffeat",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x4fe,
                  "void resolve_iffeature_getsizes(struct lys_iffeature *, unsigned int *, unsigned int *)"
                 );
  }
  if (iffeat->expr == (uint8_t *)0x0) {
    uVar3 = 0;
    uVar5 = 0;
  }
  else {
    uVar3 = 0;
    iVar4 = 0;
    iVar1 = 0;
    do {
      pos = iVar1;
      bVar2 = iff_getop(iffeat->expr,pos);
      if (bVar2 - 1 < 2) {
        bVar6 = iVar4 == 0;
        iVar4 = iVar4 + 1;
        if (bVar6) {
          iVar4 = 2;
        }
      }
      else if (bVar2 == 3) {
        uVar3 = uVar3 + 1;
        bVar6 = iVar4 == 0;
        iVar4 = iVar4 + -1;
        if (bVar6) break;
      }
      else if (bVar2 == 0) {
        iVar4 = iVar4 + (uint)(iVar4 == 0);
      }
      iVar1 = pos + 1;
    } while (iVar4 != 0);
    uVar5 = pos + 1;
  }
  if (expr_size != (uint *)0x0) {
    *expr_size = uVar5;
  }
  if (feat_size != (uint *)0x0) {
    *feat_size = uVar3;
  }
  return;
}

Assistant:

void
resolve_iffeature_getsizes(struct lys_iffeature *iffeat, unsigned int *expr_size, unsigned int *feat_size)
{
    unsigned int e = 0, f = 0, r = 0;
    uint8_t op;

    assert(iffeat);

    if (!iffeat->expr) {
        goto result;
    }

    do {
        op = iff_getop(iffeat->expr, e++);
        switch (op) {
        case LYS_IFF_NOT:
            if (!r) {
                r += 1;
            }
            break;
        case LYS_IFF_AND:
        case LYS_IFF_OR:
            if (!r) {
                r += 2;
            } else {
                r += 1;
            }
            break;
        case LYS_IFF_F:
            f++;
            if (r) {
                r--;
            }
            break;
        }
    } while(r);

result:
    if (expr_size) {
        *expr_size = e;
    }
    if (feat_size) {
        *feat_size = f;
    }
}